

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_linear.c
# Opt level: O0

SRC_STATE * linear_state_new(int channels,SRC_ERROR *error)

{
  LINEAR_DATA *pLVar1;
  SRC_STATE *state;
  SRC_ERROR *error_local;
  SRC_STATE *pSStack_10;
  int channels_local;
  
  if (channels < 1) {
    __assert_fail("channels > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_linear.c"
                  ,199,"SRC_STATE *linear_state_new(int, SRC_ERROR *)");
  }
  if (error != (SRC_ERROR *)0x0) {
    pSStack_10 = (SRC_STATE *)calloc(1,0x50);
    if (pSStack_10 == (SRC_STATE *)0x0) {
      *error = SRC_ERR_MALLOC_FAILED;
      pSStack_10 = (SRC_STATE *)0x0;
    }
    else {
      pSStack_10->channels = channels;
      pSStack_10->mode = SRC_MODE_PROCESS;
      pLVar1 = linear_data_new(pSStack_10->channels);
      pSStack_10->private_data = pLVar1;
      if (pSStack_10->private_data == (void *)0x0) {
        free(pSStack_10);
        *error = SRC_ERR_MALLOC_FAILED;
        pSStack_10 = (SRC_STATE *)0x0;
      }
      else {
        pSStack_10->vt = &linear_state_vt;
        linear_reset(pSStack_10);
        *error = SRC_ERR_NO_ERROR;
      }
    }
    return pSStack_10;
  }
  __assert_fail("error != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/src/src_linear.c"
                ,200,"SRC_STATE *linear_state_new(int, SRC_ERROR *)");
}

Assistant:

LIBSAMPLERATE_DLL_PRIVATE SRC_STATE *
linear_state_new (int channels, SRC_ERROR *error)
{
	assert (channels > 0) ;
	assert (error != NULL) ;

	SRC_STATE *state = (SRC_STATE *) calloc (1, sizeof (SRC_STATE)) ;
	if (!state)
	{
		*error = SRC_ERR_MALLOC_FAILED ;
		return NULL ;
	}

	state->channels = channels ;
	state->mode = SRC_MODE_PROCESS ;

	state->private_data = linear_data_new (state->channels) ;
	if (!state->private_data)
	{
		free (state) ;
		*error = SRC_ERR_MALLOC_FAILED ;
		return NULL ;
	}

	state->vt = &linear_state_vt ;

	linear_reset (state) ;

	*error = SRC_ERR_NO_ERROR ;

	return state ;
}